

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall kj::anon_unknown_36::WebSocketImpl::close(WebSocketImpl *this,int __fd)

{
  uint16_t in_CX;
  uint in_EDX;
  char *in_R8;
  StringPtr reason;
  ArrayPtr<const_unsigned_char> message;
  Promise<void> promise;
  Array<unsigned_char> payload;
  
  reason.content.size_ = (size_t)in_R8;
  reason.content.ptr = in_R8;
  serializeClose(&payload,(WebSocketImpl *)(ulong)in_EDX,in_CX,reason);
  message.size_ = (size_t)payload.ptr;
  message.ptr = (uchar *)0x8;
  sendImpl((WebSocketImpl *)&promise,(byte)__fd,message);
  Promise<void>::attach<kj::Array<unsigned_char>>
            ((Promise<void> *)this,(Array<unsigned_char> *)&promise);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Array<unsigned_char>::~Array(&payload);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
    kj::Array<byte> payload = serializeClose(code, reason);
    auto promise = sendImpl(OPCODE_CLOSE, payload);
    return promise.attach(kj::mv(payload));
  }